

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peers.cpp
# Opt level: O2

int __thiscall
Peers::broadcast(Peers *this,string *message,
                function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)> *callback
                )

{
  size_t in_RCX;
  int iVar1;
  int in_R8D;
  _Base_ptr p_Var2;
  undefined1 auVar3 [16];
  
  iVar1 = 0;
  p_Var2 = (this->m_peers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var2 != &(this->m_peers)._M_t._M_impl.super__Rb_tree_header) {
    Peer::send(*(Peer **)(p_Var2 + 2),(int)message,callback,in_RCX,in_R8D);
    iVar1 = iVar1 + 1;
    auVar3 = std::_Rb_tree_increment(p_Var2);
    callback = auVar3._8_8_;
    p_Var2 = auVar3._0_8_;
  }
  return iVar1;
}

Assistant:

int Peers::broadcast(const std::string &message,
                     std::function<void(const std::unique_ptr<Peer> &)> callback)
{
    int sent = 0;
    for (const auto &[_, peer] : m_peers) {
        try {
            peer->send(message);
            ++sent;
        } catch (const PeerException &e) {
            if (callback != nullptr) {
                callback(peer);
                continue;
            }
            throw e;
        }
    }
    return sent;
}